

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
               (string *s,char *fmt,unsigned_short *v,unsigned_short *args,unsigned_short *args_1,
               unsigned_short *args_2,unsigned_short *args_3,unsigned_short *args_4,
               OctahedralVector *args_5,Vector3<float> *args_6,float *args_7,uint *args_8,
               float *args_9,uint *args_10,float *args_11,uint *args_12)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char **v_00;
  unsigned_short *v_01;
  char *s_00;
  int line;
  char cVar5;
  string nextFmt;
  char *fmt_local;
  undefined8 local_200 [4];
  undefined8 local_1e0;
  enable_if_t<_std::is_class<typename_std::decay_t<const_char_*>_>::value,_std::string> local_1d8;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  v_00 = (char **)args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar5 = (char)&nextFmt;
  lVar1 = std::__cxx11::string::find(cVar5,0x2a);
  lVar2 = std::__cxx11::string::find(cVar5,0x73);
  lVar3 = std::__cxx11::string::find(cVar5,100);
  if (lVar1 != -1) {
    s_00 = "MEH";
    line = 0xbe;
LAB_00410f98:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
             ,line,s_00);
  }
  if (lVar3 == -1) {
    if (lVar2 != -1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,*v);
      std::__cxx11::stringbuf::str();
      local_1e0 = local_200[0];
      formatOne<char_const*>(&local_1d8,(detail *)nextFmt._M_dataplus._M_p,(char *)&local_1e0,v_00);
      std::__cxx11::string::append((string *)s);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      goto LAB_00410ed5;
    }
    if (nextFmt._M_string_length == 0) {
      s_00 = "Excess values passed to Printf.";
      line = 0x10d;
      goto LAB_00410f98;
    }
    formatOne<unsigned_short_const&>
              ((enable_if_t<_std::is_class<typename_std::decay_t<const_unsigned_short_&>_>::value,_std::string>
                *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,(unsigned_short *)v_00);
    std::__cxx11::string::append((string *)s);
  }
  else {
    uVar4 = std::__cxx11::string::find((char)&nextFmt,100);
    v_01 = (unsigned_short *)0x43920f;
    std::__cxx11::string::replace((ulong)&nextFmt,uVar4,(char *)0x1);
    formatOne<unsigned_short_const&>
              ((enable_if_t<_std::is_class<typename_std::decay_t<const_unsigned_short_&>_>::value,_std::string>
                *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,v_01);
    std::__cxx11::string::append((string *)s);
  }
  std::__cxx11::string::~string((string *)&ss);
LAB_00410ed5:
  stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10
             ,args_11,args_12);
  std::__cxx11::string::~string((string *)&nextFmt);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}